

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colWord.c
# Opt level: O1

void Col_SortWords(Col_Word *first,Col_Word *last,Col_WordCompareProc *proc,
                  Col_ClientData clientData)

{
  Col_Word CVar1;
  Col_Word CVar2;
  int iVar3;
  Col_Word *pCVar4;
  Col_Word *pCVar5;
  Col_Word *pCVar6;
  long local_50;
  Col_Word *local_48;
  
  if (last <= first) {
    return;
  }
LAB_0010d574:
LAB_0010d582:
  local_48 = first + -1;
  CVar1 = *last;
  local_50 = 0;
  pCVar5 = local_48;
  pCVar4 = last;
LAB_0010d59f:
  pCVar6 = pCVar5;
  pCVar5 = pCVar6 + 1;
  if (*pCVar5 != CVar1) goto code_r0x0010d5aa;
  goto LAB_0010d5c2;
code_r0x0010d5aa:
  iVar3 = (*proc)(*pCVar5,CVar1,clientData);
  if (iVar3 < 0) goto LAB_0010d59f;
LAB_0010d5c2:
  do {
    pCVar4 = pCVar4 + -1;
    if ((CVar1 == *pCVar4) || (iVar3 = (*proc)(CVar1,*pCVar4,clientData), pCVar4 == first)) break;
  } while (iVar3 < 0);
  if (pCVar5 < pCVar4) {
    CVar2 = *pCVar4;
    *pCVar4 = *pCVar5;
    *pCVar5 = CVar2;
    if ((CVar2 == CVar1) || (iVar3 = (*proc)(CVar2,CVar1,clientData), iVar3 == 0)) {
      CVar2 = *pCVar5;
      *pCVar5 = local_48[1];
      local_48[1] = CVar2;
      local_48 = local_48 + 1;
    }
    if ((CVar1 == *pCVar4) || (iVar3 = (*proc)(CVar1,*pCVar4,clientData), iVar3 == 0)) {
      CVar2 = *(Col_Word *)((long)last + local_50 + -8);
      *(Col_Word *)((long)last + local_50 + -8) = *pCVar4;
      local_50 = local_50 + -8;
      *pCVar4 = CVar2;
    }
    goto LAB_0010d59f;
  }
  CVar1 = *last;
  *last = *pCVar5;
  *pCVar5 = CVar1;
  pCVar5 = pCVar6;
  for (pCVar4 = first; pCVar4 < local_48; pCVar4 = pCVar4 + 1) {
    CVar1 = *pCVar5;
    *pCVar5 = *pCVar4;
    *pCVar4 = CVar1;
    pCVar5 = pCVar5 + -1;
  }
  pCVar6 = pCVar6 + 2;
  if (local_50 < -8) {
    pCVar4 = last + -1;
    do {
      CVar1 = *pCVar4;
      *pCVar4 = *pCVar6;
      *pCVar6 = CVar1;
      pCVar6 = pCVar6 + 1;
      pCVar4 = pCVar4 + -1;
    } while ((Col_Word *)(local_50 + (long)last) < pCVar4);
  }
  if ((long)last - (long)pCVar6 <= (long)pCVar5 - (long)first) goto LAB_0010d704;
  Col_SortWords(first,pCVar5,proc,clientData);
  first = pCVar6;
  if (last <= pCVar6) {
    return;
  }
  goto LAB_0010d582;
LAB_0010d704:
  Col_SortWords(pCVar6,last,proc,clientData);
  last = pCVar5;
  if (pCVar5 <= first) {
    return;
  }
  goto LAB_0010d574;
}

Assistant:

void
Col_SortWords(
    Col_Word *first,            /*!< First word of array to sort. */
    Col_Word *last,             /*!< Last word of array to sort. */
    Col_WordCompareProc *proc,  /*!< Comparison proc for sorting. */
    Col_ClientData clientData)  /*!< Opaque data passed as is to **proc**. */
{
/*! \cond IGNORE */
    Col_Word *i, *j, *k, *p, *q;
    Col_Word v;

#define SWAP(a, b) {Col_Word tmp=b; b=a; a=tmp;}

    /*
     * Entry point for tail recursive calls.
     */

#define TAIL_RECURSE(_first, _last) \
    first = (_first); last = (_last); goto start;

start:

    if (last <= first) return;
    i = p = first-1; j = q = last;
    v = *last;
    for (;;) {
        /*
         * Move from left to find an element that is not less.
         */

        while (*++i != v && proc(*i, v, clientData) < 0);

        /*
         * Move from right to find an element that is not greater.
         */

        while (v != *--j && proc(v, *j, clientData) < 0) if (j == first) break;

        /*
         * Stop if pointers have crossed.
         */

        if (i >= j) break;

        /*
         * Exchange.
         */

        SWAP(*i, *j);

        /*
         * If left element equal, exchange to left end.
         */

        if (*i == v || proc(*i, v, clientData) == 0) { p++; SWAP(*p, *i); }

        /*
         * If right element equal, exchange to right end.
         */

        if (v == *j || proc(v, *j, clientData) == 0) { q--; SWAP(*j, *q); }
    }
    SWAP(*i, *last); j = i-1; i = i+1;

    /*
     * Swap left equals to center.
     */

    for (k = first; k < p; k++, j--) SWAP(*k, *j);

    /*
     * Swap right equals to center.
     */

    for (k = last-1; k > q; k--, i++) SWAP(*i, *k);

    /*
     * Recurse on smallest subrange and tail call on largest to minimize
     * recursion depth and ensure O(logn) space.
     */

    if (j-first < last-i) {
        /*
         * Left subrange is shorter.
         */

        Col_SortWords(first, j, proc, clientData);
        TAIL_RECURSE(i, last);
    } else {
        /*
         * Right subrange is shorter.
         */

        Col_SortWords(i, last, proc, clientData);
        TAIL_RECURSE(first, j);
    }

#undef TAIL_RECURSE
#undef SWAP
/*! \endcond *//* IGNORE */
}